

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::ReorganizeDataLayerParams::MergePartialFromCodedStream
          (ReorganizeDataLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  ulong uVar4;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong unaff_R13;
  bool bVar9;
  pair<unsigned_long,_bool> pVar10;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001384eb;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001384eb:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    uVar5 = (uint32)uVar8;
    iVar7 = 6;
    if ((uVar8 & 0x100000000) == 0) {
LAB_0013855f:
      if ((uVar5 & 7) == 4 || uVar5 == 0) {
        iVar7 = 7;
      }
      else {
        bVar9 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
        if (bVar9) goto LAB_00138586;
      }
    }
    else {
      uVar6 = (uint)(uVar8 >> 3) & 0x1fffffff;
      if (uVar6 == 2) {
        if ((char)uVar8 != '\x10') goto LAB_0013855f;
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (-1 < (long)(char)*puVar3)) {
          this->blocksize_ = (long)(char)*puVar3;
          input->buffer_ = puVar3 + 1;
        }
        else {
          pVar10 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->blocksize_ = pVar10.first;
          if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_00138588;
        }
      }
      else {
        if ((uVar6 != 1) || ((char)uVar8 != '\b')) goto LAB_0013855f;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar8 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_001385aa;
          input->buffer_ = pbVar2 + 1;
          bVar9 = true;
        }
        else {
          uVar5 = 0;
LAB_001385aa:
          uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          bVar9 = -1 < (long)uVar8;
        }
        uVar4 = unaff_R13;
        if (bVar9) {
          uVar4 = uVar8;
        }
        unaff_R13 = uVar4 & 0xffffffff;
        if (!bVar9) goto LAB_00138588;
        this->mode_ = (int)uVar4;
      }
LAB_00138586:
      iVar7 = 0;
    }
LAB_00138588:
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool ReorganizeDataLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ReorganizeDataLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.ReorganizeDataLayerParams.ReorganizationType mode = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_mode(static_cast< ::CoreML::Specification::ReorganizeDataLayerParams_ReorganizationType >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 blockSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &blocksize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ReorganizeDataLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ReorganizeDataLayerParams)
  return false;
#undef DO_
}